

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

FILE * pugi::impl::anon_unknown_0::open_file_wide(wchar_t *path,wchar_t *mode)

{
  FILE *result;
  size_t i;
  char *pcStack_28;
  char mode_ascii [4];
  char *path_utf8;
  wchar_t *mode_local;
  wchar_t *path_local;
  
  pcStack_28 = convert_path_heap(path);
  if (pcStack_28 == (char *)0x0) {
    path_local = (wchar_t *)0x0;
  }
  else {
    memset((void *)((long)&i + 4),0,4);
    for (result = (FILE *)0x0; mode[(long)result] != L'\0'; result = result + 1) {
      result[(long)&i + 4] = SUB41(mode[(long)result],0);
    }
    path_local = &fopen(pcStack_28,(char *)((long)&i + 4))->_flags;
    (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
              (pcStack_28);
  }
  return (FILE *)path_local;
}

Assistant:

PUGI__FN FILE* open_file_wide(const wchar_t* path, const wchar_t* mode)
	{
		// there is no standard function to open wide paths, so our best bet is to try utf8 path
		char* path_utf8 = convert_path_heap(path);
		if (!path_utf8) return 0;

		// convert mode to ASCII (we mirror _wfopen interface)
		char mode_ascii[4] = {0};
		for (size_t i = 0; mode[i]; ++i) mode_ascii[i] = static_cast<char>(mode[i]);

		// try to open the utf8 path
		FILE* result = fopen(path_utf8, mode_ascii);

		// free dummy buffer
		xml_memory::deallocate(path_utf8);

		return result;
	}